

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue JS_ReadTypedArray(BCReaderState *s)

{
  JSContext *ctx;
  int iVar1;
  JSValueUnion JVar2;
  JSArrayBuffer *pJVar3;
  double dVar4;
  int64_t iVar5;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue JVar6;
  uint8_t array_tag;
  uint32_t len;
  uint32_t offset;
  byte local_89;
  JSValueUnion local_88;
  uint local_80;
  uint local_7c;
  int64_t local_78;
  ulong local_70;
  JSValueUnion local_68;
  int64_t local_60;
  double local_58;
  undefined8 local_50;
  double local_48;
  undefined8 local_40;
  
  ctx = s->ctx;
  local_88.float64 = 0.0;
  iVar1 = bc_get_u8(s,&local_89);
  if (iVar1 == 0) {
    if (8 < local_89) {
      JS_ThrowTypeError(ctx,"invalid typed array");
      return (JSValue)(ZEXT816(6) << 0x40);
    }
    iVar1 = bc_get_leb128(s,&local_80);
    if ((iVar1 == 0) && (iVar1 = bc_get_leb128(s,&local_7c), iVar1 == 0)) {
      local_70 = (ulong)(uint)s->objects_count;
      JVar2.float64 = 0.0;
      iVar1 = BC_add_object_ref1(s,(JSObject *)0x0);
      JVar6.tag = 3;
      JVar6.u.float64 = local_88.float64;
      iVar5 = 3;
      if (iVar1 != 0) {
LAB_0013f33f:
        local_88 = JVar6.u;
        v.tag = iVar5;
        v.u.float64 = JVar2.float64;
        JS_FreeValue(ctx,v);
        v_00.tag = JVar6.tag;
        v_00.u.float64 = local_88.float64;
        JS_FreeValue(ctx,v_00);
        return (JSValue)(ZEXT816(6) << 0x40);
      }
      _local_68 = JS_ReadObjectRec(s);
      local_78 = local_68;
      JVar2 = local_68;
      if (local_68._8_4_ != 6) {
        pJVar3 = js_get_array_buffer(ctx,_local_68);
        if (pJVar3 != (JSArrayBuffer *)0x0) {
          dVar4 = (double)(long)(int)local_7c;
          local_58 = (double)local_7c;
          if (-1 < (long)dVar4) {
            local_58 = dVar4;
          }
          local_50 = 7;
          if (-1 < (long)dVar4) {
            local_50 = 0;
          }
          dVar4 = (double)(long)(int)local_80;
          local_48 = (double)local_80;
          if (-1 < (long)dVar4) {
            local_48 = dVar4;
          }
          local_40 = 7;
          if (-1 < (long)dVar4) {
            local_40 = 0;
          }
          JVar6 = js_typed_array_constructor
                            (ctx,(JSValue)(ZEXT816(3) << 0x40),(int)local_50,(JSValue *)&local_68,
                             local_89 + 0x15);
          local_88 = JVar6.u;
          iVar5 = local_78;
          if ((int)JVar6.tag != 6) {
            if (0xffffff < *(uint *)&s->field_0x34) {
              *(JSValueUnion *)(s->objects + local_70) = local_88;
            }
            v_01.tag = local_78;
            v_01.u.ptr = JVar2.ptr;
            JS_FreeValue(ctx,v_01);
            return JVar6;
          }
          goto LAB_0013f33f;
        }
        JS_FreeValue(ctx,_local_68);
      }
    }
  }
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue JS_ReadTypedArray(BCReaderState *s)
{
    JSContext *ctx = s->ctx;
    JSValue obj = JS_UNDEFINED, array_buffer = JS_UNDEFINED;
    uint8_t array_tag;
    JSValueConst args[3];
    uint32_t offset, len, idx;
    
    if (bc_get_u8(s, &array_tag))
        return JS_EXCEPTION;
    if (array_tag >= JS_TYPED_ARRAY_COUNT)
        return JS_ThrowTypeError(ctx, "invalid typed array");
    if (bc_get_leb128(s, &len))
        return JS_EXCEPTION;
    if (bc_get_leb128(s, &offset))
        return JS_EXCEPTION;
    /* XXX: this hack could be avoided if the typed array could be
       created before the array buffer */
    idx = s->objects_count;
    if (BC_add_object_ref1(s, NULL))
        goto fail;
    array_buffer = JS_ReadObjectRec(s);
    if (JS_IsException(array_buffer))
        return JS_EXCEPTION;
    if (!js_get_array_buffer(ctx, array_buffer)) {
        JS_FreeValue(ctx, array_buffer);
        return JS_EXCEPTION;
    }
    args[0] = array_buffer;
    args[1] = JS_NewInt64(ctx, offset);
    args[2] = JS_NewInt64(ctx, len);
    obj = js_typed_array_constructor(ctx, JS_UNDEFINED,
                                     3, args,
                                     JS_CLASS_UINT8C_ARRAY + array_tag);
    if (JS_IsException(obj))
        goto fail;
    if (s->allow_reference) {
        s->objects[idx] = JS_VALUE_GET_OBJ(obj);
    }
    JS_FreeValue(ctx, array_buffer);
    return obj;
 fail:
    JS_FreeValue(ctx, array_buffer);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}